

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O0

void __thiscall
deqp::gls::ProgramContext::ProgramContext
          (ProgramContext *this,char *vtxShaderSource_,char *fragShaderSource_,
          char *positionAttrName_)

{
  char *pcVar1;
  allocator<char> local_3e;
  allocator<char> local_3d [20];
  allocator<char> local_29;
  char *local_28;
  char *positionAttrName__local;
  char *fragShaderSource__local;
  char *vtxShaderSource__local;
  ProgramContext *this_local;
  
  local_28 = positionAttrName_;
  positionAttrName__local = fragShaderSource_;
  fragShaderSource__local = vtxShaderSource_;
  vtxShaderSource__local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,vtxShaderSource_,&local_29);
  std::allocator<char>::~allocator(&local_29);
  pcVar1 = positionAttrName__local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->fragmentSource,pcVar1,local_3d);
  std::allocator<char>::~allocator(local_3d);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::vector(&this->attributes);
  std::vector<deqp::gls::VarSpec,_std::allocator<deqp::gls::VarSpec>_>::vector(&this->uniforms);
  std::vector<deqp::gls::TextureSpec,_std::allocator<deqp::gls::TextureSpec>_>::vector
            (&this->textureSpecs);
  pcVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->positionAttrName,pcVar1,&local_3e);
  std::allocator<char>::~allocator(&local_3e);
  return;
}

Assistant:

ProgramContext (const char* const vtxShaderSource_,
					const char* const fragShaderSource_,
					const char* const positionAttrName_)
		: vertexSource		(vtxShaderSource_)
		, fragmentSource	(fragShaderSource_)
		, positionAttrName	(positionAttrName_)
	{
	}